

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O2

bool __thiscall OpenMD::SelectionCompiler::clauseIndex(SelectionCompiler *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  type_info *this_00;
  any intVal;
  Token token;
  any local_88;
  Token local_78;
  any local_60;
  Token local_50;
  Token local_38;
  
  tokenNext(&local_50,this);
  if (local_50.tok == 2) {
    uVar2 = std::any_cast<int>(&local_50.value);
    iVar3 = tokPeek(this);
    if (iVar3 == 0x402) {
      tokenNext(&local_38,this);
      std::any::reset(&local_38.value);
      iVar3 = tokPeek(this);
      if (iVar3 == 2) {
        tokenNext(&local_78,this);
        std::any::any(&local_88,&local_78.value);
        std::any::reset(&local_78.value);
        this_00 = std::any::type(&local_88);
        bVar1 = std::type_info::operator!=(this_00,(type_info *)&int::typeinfo);
        if (!bVar1) {
          iVar3 = std::any_cast<int>(&local_88);
          local_60._M_storage._4_4_ = iVar3;
          local_60._M_storage._0_4_ = uVar2;
          local_60._M_manager = std::any::_Manager_internal<std::pair<int,_int>_>::_S_manage;
          Token::Token(&local_78,0x10400,&local_60);
          std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
                    (&this->ltokenPostfix,&local_78);
          std::any::reset(&local_78.value);
          std::any::reset(&local_60);
        }
        bVar1 = !bVar1;
        std::any::reset(&local_88);
      }
      else {
        bVar1 = numberExpected(this);
      }
    }
    else {
      local_88._M_manager = std::any::_Manager_internal<int>::_S_manage;
      local_88._M_storage._4_4_ = 0;
      local_88._M_storage._0_4_ = uVar2;
      Token::Token(&local_78,0x10400,&local_88);
      std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
                (&this->ltokenPostfix,&local_78);
      std::any::reset(&local_78.value);
      std::any::reset(&local_88);
      bVar1 = true;
    }
  }
  else {
    bVar1 = numberExpected(this);
  }
  std::any::reset(&local_50.value);
  return bVar1;
}

Assistant:

bool SelectionCompiler::clauseIndex() {
    Token token = tokenNext();
    if (token.tok == Token::integer) {
      int index = std::any_cast<int>(token.value);
      int tok   = tokPeek();
      if (tok == Token::to) {
        tokenNext();
        tok = tokPeek();
        if (tok != Token::integer) { return numberExpected(); }

        std::any intVal = tokenNext().value;
        int first       = index;
        if (intVal.type() != typeid(int)) { return false; }
        int second = std::any_cast<int>(intVal);

        return addTokenToPostfix(
            Token(Token::index, std::any(std::make_pair(first, second))));

      } else {
        return addTokenToPostfix(Token(Token::index, std::any(index)));
      }
    } else {
      return numberExpected();
    }
  }